

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

bool __thiscall
imrt::EvaluationFunction::Zupdate
          (EvaluationFunction *this,int angle,int b,double delta_intensity,bool return_if_unfeasible
          ,vector<double,_std::allocator<double>_> *Zmax)

{
  double *pdVar1;
  double dVar2;
  int iVar4;
  long lVar5;
  pair<int,_int> pVar6;
  bool bVar7;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__x;
  Matrix *pMVar8;
  _Base_ptr p_Var9;
  long lVar10;
  double dVar11;
  double dVar12;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  value_type local_70;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  double dVar3;
  
  local_70.first.second = b;
  local_70.first.first = angle;
  __x = &std::__detail::
         _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::at((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->beamlet2voxel_list,&local_70.first)->_M_t;
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::_Rb_tree(&local_60,__x);
  bVar7 = true;
  p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var9 == &local_60._M_impl.super__Rb_tree_header) {
LAB_0011224e:
      std::
      _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&local_60);
      return bVar7;
    }
    iVar4 = *(int *)&p_Var9[1]._M_parent;
    pVar6 = (pair<int,_int>)p_Var9[1]._M_parent;
    lVar10 = (long)*(int *)((long)&p_Var9[1]._M_parent + 4);
    pMVar8 = Volume::getDepositionMatrix
                       ((this->volumes->
                        super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                        super__Vector_impl_data._M_start + iVar4,angle);
    dVar11 = pMVar8->p[lVar10][b] * delta_intensity;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      lVar5 = *(long *)&(this->Z).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar4].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      dVar12 = *(double *)(lVar5 + lVar10 * 8) + dVar11;
      pdVar1 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      dVar2 = *pdVar1;
      dVar3 = *pdVar1;
      if (return_if_unfeasible &&
          ((!NAN(dVar12) && !NAN(*pdVar1)) && (dVar12 >= dVar3 && dVar12 != dVar2))) {
        bVar7 = false;
        goto LAB_0011224e;
      }
      *(double *)(lVar5 + lVar10 * 8) = dVar12;
      local_70.first = pVar6;
      local_70.second = dVar11;
      std::__cxx11::
      list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
      ::push_back(&this->Z_diff,&local_70);
      bVar7 = (bool)(bVar7 & (dVar12 < dVar3 || dVar12 == dVar2));
    }
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

bool EvaluationFunction::Zupdate(int angle, int b, double delta_intensity, bool return_if_unfeasible,
			vector<double>& Zmax){

	multimap<double, pair<int,int> > voxels = beamlet2voxel_list.at(make_pair(angle,b));
	bool feasible = true;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 if(Z[o][k] + delta > Zmax[o]){
			 feasible=false;
			 if(return_if_unfeasible) return feasible;
		 }

		 Z[o][k] += delta;
		 Z_diff.push_back(make_pair(make_pair(o,k),delta));
	 }

	 return feasible;
}